

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

int orient_3d_filter(double *p0,double *p1,double *p2,double *p3)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  dVar3 = *p0;
  dVar9 = p0[1];
  dVar2 = p1[1] - dVar9;
  dVar8 = p0[2];
  dVar5 = p1[2] - dVar8;
  dVar6 = p2[1] - dVar9;
  dVar7 = p2[2] - dVar8;
  dVar9 = p3[1] - dVar9;
  dVar8 = p3[2] - dVar8;
  dVar4 = ABS(*p1 - dVar3);
  dVar10 = ABS(*p2 - dVar3);
  if (dVar10 <= dVar4) {
    dVar10 = dVar4;
  }
  dVar4 = ABS(*p3 - dVar3);
  if (dVar4 <= dVar10) {
    dVar4 = dVar10;
  }
  dVar10 = ABS(dVar5);
  if (ABS(dVar5) <= ABS(dVar2)) {
    dVar10 = ABS(dVar2);
  }
  dVar12 = ABS(dVar6);
  dVar14 = ABS(dVar7);
  dVar13 = dVar14;
  if (dVar14 <= dVar12) {
    dVar13 = dVar12;
  }
  if (dVar12 <= dVar10) {
    dVar12 = dVar10;
  }
  if (dVar14 <= dVar12) {
    dVar14 = dVar12;
  }
  dVar10 = ABS(dVar9);
  if (ABS(dVar9) <= dVar13) {
    dVar10 = dVar13;
  }
  dVar12 = ABS(dVar8);
  if (ABS(dVar8) <= dVar10) {
    dVar12 = dVar10;
  }
  dVar10 = dVar14;
  dVar13 = dVar4;
  if ((dVar4 <= dVar14) && (dVar10 = dVar4, dVar4 < dVar14)) {
    dVar13 = dVar14;
  }
  dVar11 = dVar12;
  if ((dVar10 <= dVar12) && (dVar11 = dVar10, dVar13 < dVar12)) {
    dVar13 = dVar12;
  }
  iVar1 = 0;
  if ((1.632880184967483e-98 <= dVar11) && (dVar13 <= 5.599361855444509e+101)) {
    dVar10 = dVar4 * dVar14 * dVar12 * 5.11071278299733e-15;
    dVar3 = (*p3 - dVar3) * (dVar2 * dVar7 - dVar6 * dVar5) +
            ((*p1 - dVar3) * (dVar6 * dVar8 - dVar9 * dVar7) -
            (dVar8 * dVar2 - dVar9 * dVar5) * (*p2 - dVar3));
    iVar1 = 1;
    if ((dVar3 <= dVar10) && (iVar1 = 0, dVar3 < -dVar10)) {
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

inline int orient_3d_filter(const double* p0, const double* p1, const double* p2, const double* p3) {
    double a11;
    a11 = (p1[0] - p0[0]);
    double a12;
    a12 = (p1[1] - p0[1]);
    double a13;
    a13 = (p1[2] - p0[2]);
    double a21;
    a21 = (p2[0] - p0[0]);
    double a22;
    a22 = (p2[1] - p0[1]);
    double a23;
    a23 = (p2[2] - p0[2]);
    double a31;
    a31 = (p3[0] - p0[0]);
    double a32;
    a32 = (p3[1] - p0[1]);
    double a33;
    a33 = (p3[2] - p0[2]);
    double Delta;
    Delta = (((a11 * ((a22 * a33) - (a23 * a32))) - (a21 * ((a12 * a33) - (a13 * a32)))) + (a31 * ((a12 * a23) - (a13 * a22))));
    int int_tmp_result;
    double eps;
    double max1 = fabs(a11);
    if((max1 < fabs(a21)))
    {
        max1 = fabs(a21);
    }
    if((max1 < fabs(a31)))
    {
        max1 = fabs(a31);
    }
    double max2 = fabs(a12);
    if((max2 < fabs(a13)))
    {
        max2 = fabs(a13);
    }
    if((max2 < fabs(a22)))
    {
        max2 = fabs(a22);
    }
    if((max2 < fabs(a23)))
    {
        max2 = fabs(a23);
    }
    double max3 = fabs(a22);
    if((max3 < fabs(a23)))
    {
        max3 = fabs(a23);
    }
    if((max3 < fabs(a32)))
    {
        max3 = fabs(a32);
    }
    if((max3 < fabs(a33)))
    {
        max3 = fabs(a33);
    }
    double lower_bound_1;
    double upper_bound_1;
    lower_bound_1 = max1;
    upper_bound_1 = max1;
    if((max2 < lower_bound_1))
    {
        lower_bound_1 = max2;
    }
    else
    {
        if((max2 > upper_bound_1))
        {
            upper_bound_1 = max2;
        }
    }
    if((max3 < lower_bound_1))
    {
        lower_bound_1 = max3;
    }
    else
    {
        if((max3 > upper_bound_1))
        {
            upper_bound_1 = max3;
        }
    }
    if((lower_bound_1 < 1.63288018496748314939e-98))
    {
        return FPG_UNCERTAIN_VALUE;
    }
    else
    {
        if((upper_bound_1 > 5.59936185544450928309e+101))
        {
            return FPG_UNCERTAIN_VALUE;
        }
        eps = (5.11071278299732992696e-15 * ((max2 * max3) * max1));
        if((Delta > eps))
        {
            int_tmp_result = 1;
        }
        else
        {
            if((Delta < -eps))
            {
                int_tmp_result = -1;
            }
            else
            {
                return FPG_UNCERTAIN_VALUE;
            }
        }
    }
    return int_tmp_result;
}